

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenCard.cpp
# Opt level: O3

int __thiscall GreenCard::addBonus(GreenCard *this,int money,int honour)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  Item *temp;
  string ans;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  if (this->type == FOLLOWER) {
    iVar1 = Follower::getEffectCost((Follower *)this);
    if (money < iVar1) {
      pcVar6 = "Not enough money";
      lVar5 = 0x10;
    }
    else {
      iVar1 = Follower::getMinimumHonor((Follower *)this);
      if (iVar1 <= honour) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Do you want to upgrade your card ",0x21);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                            (this->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"?",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost: ",6);
        iVar1 = Follower::getEffectCost((Follower *)this);
        plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        poVar3 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Bonus: ",7);
        iVar1 = Follower::getEffectBonus((Follower *)this);
        plVar4 = (long *)std::ostream::operator<<(poVar3,iVar1);
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Enter y for yes, n for no",0x19);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        local_48 = &local_38;
        local_40 = 0;
        local_38 = 0;
        std::operator>>((istream *)&std::cin,(string *)&local_48);
        iVar1 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar1 == 0) {
          iVar1 = Follower::getAttackBonus((Follower *)this);
          iVar2 = Follower::getEffectCost((Follower *)this);
          Follower::setAttackBonus((Follower *)this,iVar2 + iVar1);
          iVar1 = Follower::getDefenseBonus((Follower *)this);
          iVar2 = Follower::getEffectBonus((Follower *)this);
          Follower::setDefenseBonus((Follower *)this,iVar2 + iVar1);
          iVar1 = Follower::getEffectCost((Follower *)this);
          goto LAB_0010a8b5;
        }
        goto LAB_0010a8b7;
      }
      pcVar6 = "Not honourable enough";
      lVar5 = 0x15;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  else {
    if (money < this->cost) {
      return money;
    }
    if (honour < this->minimumHonor) {
      return money;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Do you want to upgrade your card ",0x21);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                        (this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"?",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost: ",6);
    iVar1 = Item::getEffectCost((Item *)this);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Bonus: ",7);
    iVar1 = Item::getEffectBonus((Item *)this);
    plVar4 = (long *)std::ostream::operator<<(poVar3,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter y for yes, n for no",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    local_48 = &local_38;
    local_40 = 0;
    local_38 = 0;
    std::operator>>((istream *)&std::cin,(string *)&local_48);
    iVar1 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar1 == 0) {
      iVar1 = Item::getAttackBonus((Item *)this);
      iVar2 = Item::getEffectCost((Item *)this);
      Item::setAttackBonus((Item *)this,iVar2 + iVar1);
      iVar1 = Item::getDefenseBonus((Item *)this);
      iVar2 = Item::getEffectBonus((Item *)this);
      Item::setDefenseBonus((Item *)this,iVar2 + iVar1);
      iVar1 = Item::getEffectCost((Item *)this);
LAB_0010a8b5:
      money = money - iVar1;
    }
LAB_0010a8b7:
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  return money;
}

Assistant:

int GreenCard::addBonus(int money, int honour)       //if bought adds bonuses and returns new amount of money of player, else returns same amount
{                                                    //casts to follower or item to have access to cards' data
    if (type == FOLLOWER)
    {
        Follower *temp = reinterpret_cast<Follower*>(this);

        if (money < temp->getEffectCost())
        {
            cout << "Not enough money"<<endl;
            return money;
        }
        if (honour < temp->getMinimumHonor())
        {
            cout << "Not honourable enough"<<endl;
            return money;
        }

        cout << "Do you want to upgrade your card "<< name <<"?" << endl;
        cout << "Cost: "<< temp->getEffectCost() <<endl << "Bonus: "<< temp->getEffectBonus()<<endl;
        cout <<"Enter y for yes, n for no"<< endl;
        string ans;
        cin >> ans;

        if (ans != "n")
            return money;

        //add bonuses to card stats
        temp->setAttackBonus(temp->getAttackBonus() + temp->getEffectCost());
        temp->setDefenseBonus(temp->getDefenseBonus() + temp->getEffectBonus());

        return money-temp->getEffectCost();
    }
    else
    {
        Item *temp = reinterpret_cast<Item*>(this);

        if (money < cost || honour < minimumHonor)
            return money;

        cout << "Do you want to upgrade your card "<< name <<"?" << endl;
        cout << "Cost: "<< temp->getEffectCost() <<endl << "Bonus: "<< temp->getEffectBonus()<<endl;
        cout <<"Enter y for yes, n for no"<< endl;
        string ans;
        cin >> ans;

        if (ans != "n")
            return money;

        //add bonuses to card stats
        temp->setAttackBonus(temp->getAttackBonus() + temp->getEffectCost());
        temp->setDefenseBonus(temp->getDefenseBonus() + temp->getEffectBonus());

        return money-temp->getEffectCost();
    }
}